

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void print_varr_insns(gen_ctx_t gen_ctx,char *title,VARR_bb_insn_t *bb_insns)

{
  size_t sVar1;
  bb_insn_t_conflict bb_insn;
  size_t i;
  ulong ix;
  
  fprintf((FILE *)gen_ctx->debug_file,"%s insns:\n",title);
  ix = 0;
  while( true ) {
    sVar1 = VARR_bb_insn_tlength(bb_insns);
    if (sVar1 <= ix) break;
    bb_insn = VARR_bb_insn_tget(bb_insns,ix);
    if (bb_insn != (bb_insn_t_conflict)0x0) {
      fprintf((FILE *)gen_ctx->debug_file,"  %-5lu",(ulong)bb_insn->index);
      print_bb_insn(gen_ctx,bb_insn,1);
    }
    ix = ix + 1;
  }
  return;
}

Assistant:

static void print_varr_insns (gen_ctx_t gen_ctx, const char *title, VARR (bb_insn_t) * bb_insns) {
  fprintf (debug_file, "%s insns:\n", title);
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, bb_insns); i++) {
    bb_insn_t bb_insn = VARR_GET (bb_insn_t, bb_insns, i);
    if (bb_insn == NULL) continue;
    fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
    print_bb_insn (gen_ctx, bb_insn, TRUE);
  }
}